

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte bVar1;
  bool bVar2;
  void **ppvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int itemsize;
  int itemsize_00;
  int iVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  byte *pbVar15;
  byte *pbVar16;
  ulong extraout_RDX;
  uchar *puVar17;
  uchar *extraout_RDX_00;
  void *__dest;
  long lVar18;
  ulong uVar19;
  undefined4 in_register_00000034;
  uchar *puVar20;
  int iVar21;
  uint local_b0;
  uint local_ac;
  uchar *local_a8;
  uint local_9c;
  byte *local_98;
  ulong local_90;
  uchar *local_88;
  void *local_80;
  ulong local_78;
  uchar *local_70;
  uchar *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  int *local_50;
  size_t local_48;
  ulong local_40;
  void **local_38;
  
  local_90 = CONCAT44(in_register_00000034,data_len);
  local_a8 = (uchar *)0x0;
  local_88 = data;
  local_50 = out_len;
  pvVar7 = malloc(0x20000);
  if (pvVar7 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_58 = 5;
  if (5 < quality) {
    local_58 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_a8,1,itemsize);
  iVar21 = *(int *)(local_a8 + -4);
  *(int *)(local_a8 + -4) = iVar21 + 1;
  local_a8[iVar21] = 'x';
  iVar12 = *(int *)(local_a8 + -4);
  iVar21 = iVar12 + 1;
  if (*(int *)(local_a8 + -8) <= iVar21) {
    stbiw__sbgrowf(&local_a8,1,itemsize_00);
    iVar12 = *(int *)(local_a8 + -4);
    iVar21 = iVar12 + 1;
  }
  *(int *)(local_a8 + -4) = iVar21;
  local_a8[iVar12] = '^';
  local_b0 = 1;
  local_ac = local_b0;
  puVar8 = stbiw__zlib_flushf(local_a8,&local_ac,(int *)&local_b0);
  local_ac = local_ac | 1 << ((byte)local_b0 & 0x1f);
  local_b0 = local_b0 + 2;
  puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
  for (lVar9 = 0; lVar9 != 0x4000; lVar9 = lVar9 + 1) {
    *(undefined8 *)((long)pvVar7 + lVar9 * 8) = 0;
  }
  local_5c = (int)local_90 + -3;
  local_60 = (int)local_58 * 2;
  local_40 = local_58 & 0xffffffff;
  local_48 = local_40 * 8;
  uVar19 = 0;
  local_a8 = puVar8;
  local_80 = pvVar7;
  while (iVar21 = (int)uVar19, iVar21 < local_5c) {
    local_98 = local_88 + iVar21;
    local_68 = puVar8;
    uVar4 = stbiw__zhash(local_98);
    __dest = *(void **)((long)pvVar7 + (ulong)(uVar4 & 0x3fff) * 8);
    if (__dest == (void *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (long)*(int *)((long)__dest + -4);
    }
    local_38 = (void **)((long)pvVar7 + (ulong)(uVar4 & 0x3fff) * 8);
    iVar12 = (int)local_90;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    local_9c = 3;
    local_70 = (uchar *)0x0;
    pbVar15 = local_98;
    local_78 = uVar19;
    for (lVar18 = 0; lVar9 != lVar18; lVar18 = lVar18 + 1) {
      puVar8 = *(uchar **)((long)__dest + lVar18 * 8);
      if ((long)(iVar21 + -0x8000) < (long)puVar8 - (long)local_88) {
        uVar5 = stbiw__zlib_countm(puVar8,local_98,iVar12 - iVar21);
        uVar4 = local_9c;
        if ((int)local_9c < (int)uVar5) {
          uVar4 = uVar5;
        }
        bVar2 = (int)local_9c <= (int)uVar5;
        pbVar15 = local_98;
        local_9c = uVar4;
        if (bVar2) {
          local_70 = puVar8;
        }
      }
    }
    if (__dest == (void *)0x0) {
LAB_001b4160:
      ppvVar3 = local_38;
      stbiw__sbgrowf(local_38,8,(int)pbVar15);
      __dest = *ppvVar3;
      iVar21 = *(int *)((long)__dest + -4);
      iVar12 = iVar21 + 1;
      pbVar15 = local_98;
    }
    else {
      iVar21 = *(int *)((long)__dest + -4);
      if (iVar21 == local_60) {
        memmove(__dest,(void *)((long)__dest + local_40 * 8),local_48);
        iVar21 = (int)local_58;
        *(int *)((long)__dest + -4) = iVar21;
        pbVar15 = local_98;
      }
      iVar12 = iVar21 + 1;
      if (*(int *)((long)__dest + -8) <= iVar12) goto LAB_001b4160;
    }
    *(int *)((long)__dest + -4) = iVar12;
    *(byte **)((long)__dest + (long)iVar21 * 8) = pbVar15;
    pbVar16 = pbVar15;
    if (local_70 == (uchar *)0x0) {
LAB_001b421b:
      uVar5 = local_ac;
      uVar4 = local_b0;
      bVar1 = *pbVar16;
      bVar11 = (byte)local_b0;
      if (bVar1 < 0x90) {
        iVar21 = stbiw__zlib_bitrev(bVar1 + 0x30,8);
        local_ac = iVar21 << (bVar11 & 0x1f);
        local_b0 = uVar4 + 8;
      }
      else {
        iVar21 = stbiw__zlib_bitrev(bVar1 | 0x100,9);
        local_ac = iVar21 << (bVar11 & 0x1f);
        local_b0 = uVar4 + 9;
      }
      local_ac = uVar5 | local_ac;
      iVar21 = (int)local_78;
      puVar8 = local_68;
      pvVar7 = local_80;
      uVar4 = 1;
LAB_001b43e6:
      puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
    }
    else {
      uVar4 = stbiw__zhash(pbVar15 + 1);
      lVar9 = *(long *)((long)local_80 + (ulong)(uVar4 & 0x3fff) * 8);
      if (lVar9 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint *)(lVar9 + -4);
      }
      uVar5 = (uint)local_78;
      iVar21 = ~uVar5 + (int)local_90;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      pbVar16 = local_98;
      for (uVar19 = 0; pvVar7 = local_80, uVar4 != uVar19; uVar19 = uVar19 + 1) {
        puVar8 = *(uchar **)(lVar9 + uVar19 * 8);
        if (((long)(int)(uVar5 - 0x7fff) < (long)puVar8 - (long)local_88) &&
           (uVar6 = stbiw__zlib_countm(puVar8,pbVar15 + 1,iVar21), pbVar16 = local_98,
           (int)local_9c < (int)uVar6)) goto LAB_001b421b;
      }
      local_98 = pbVar16 + -(long)local_70;
      uVar19 = 0;
      do {
        uVar10 = uVar19;
        uVar19 = uVar10 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar10 + 1] <= (int)local_9c);
      iVar21 = (int)local_78;
      iVar12 = (int)(uVar10 + 1);
      if (uVar10 < 0x17) {
        iVar12 = stbiw__zlib_bitrev(iVar12,7);
        local_ac = local_ac | iVar12 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 7;
      }
      else {
        iVar12 = stbiw__zlib_bitrev(iVar12 + 0xa8,8);
        local_ac = local_ac | iVar12 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 8;
      }
      puVar8 = stbiw__zlib_flushf(local_68,&local_ac,(int *)&local_b0);
      uVar10 = uVar10 & 0xffffffff;
      if (0xffffffffffffffeb < uVar10 - 0x1c) {
        local_ac = local_ac |
                   local_9c - stbi_zlib_compress::lengthc[uVar10] << ((byte)local_b0 & 0x1f);
        local_b0 = ""[uVar10] + local_b0;
        puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
      }
      uVar19 = 0xffffffffffffffff;
      do {
        lVar9 = uVar19 + 2;
        uVar19 = uVar19 + 1;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar9] <= (int)local_98);
      iVar12 = stbiw__zlib_bitrev((int)uVar19,5);
      local_ac = local_ac | iVar12 << ((byte)local_b0 & 0x1f);
      local_b0 = local_b0 + 5;
      puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
      uVar4 = local_9c;
      if (3 < uVar19) {
        local_ac = local_ac |
                   (int)local_98 - (uint)stbi_zlib_compress::distc[uVar19 & 0xffffffff] <<
                   ((byte)local_b0 & 0x1f);
        local_b0 = ""[uVar19 & 0xffffffff] + local_b0;
        goto LAB_001b43e6;
      }
    }
    uVar19 = (ulong)(uVar4 + iVar21);
  }
  lVar9 = (long)(int)local_90;
  local_a8 = puVar8;
  for (lVar18 = (long)iVar21; uVar5 = local_ac, uVar4 = local_b0, lVar18 < lVar9;
      lVar18 = lVar18 + 1) {
    bVar1 = local_88[lVar18];
    if (bVar1 < 0x90) {
      uVar6 = bVar1 + 0x30;
      iVar21 = 8;
    }
    else {
      uVar6 = bVar1 | 0x100;
      iVar21 = 9;
    }
    iVar12 = stbiw__zlib_bitrev(uVar6,iVar21);
    local_ac = uVar5 | iVar12 << ((byte)uVar4 & 0x1f);
    local_b0 = iVar21 + uVar4;
    puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
  }
  local_a8 = puVar8;
  iVar21 = stbiw__zlib_bitrev(0,7);
  local_ac = local_ac | iVar21 << ((byte)local_b0 & 0x1f);
  uVar4 = local_b0 + 7;
  do {
    local_b0 = uVar4;
    puVar8 = stbiw__zlib_flushf(puVar8,&local_ac,(int *)&local_b0);
    pvVar7 = local_80;
    uVar4 = local_b0 + 1;
  } while (local_b0 != 0);
  local_a8 = puVar8;
  for (lVar9 = 0; lVar9 != 0x4000; lVar9 = lVar9 + 1) {
    lVar18 = *(long *)((long)pvVar7 + lVar9 * 8);
    if (lVar18 != 0) {
      free((void *)(lVar18 + -8));
    }
  }
  free(pvVar7);
  iVar21 = (int)local_90 + 0x7ffe;
  uVar19 = (long)iVar21 % 0x7fff & 0xffffffff;
  if ((iVar21 / 0x7fff) * 5 + (int)local_90 + 2 < *(int *)(puVar8 + -4)) {
    puVar8[-4] = '\x02';
    puVar8[-3] = '\0';
    puVar8[-2] = '\0';
    puVar8[-1] = '\0';
    iVar12 = 0;
    iVar21 = 2;
    while( true ) {
      iVar14 = (int)uVar19;
      uVar4 = (int)local_90 - iVar12;
      if (uVar4 == 0 || (int)local_90 < iVar12) break;
      uVar5 = 0x7fff;
      if ((int)uVar4 < 0x7fff) {
        uVar5 = uVar4;
      }
      iVar13 = iVar21 + 1;
      if (*(int *)(puVar8 + -8) <= iVar13) {
        stbiw__sbgrowf(&local_a8,1,iVar14);
        iVar21 = *(int *)(local_a8 + -4);
        iVar13 = iVar21 + 1;
        puVar8 = local_a8;
        iVar14 = extraout_EDX;
      }
      *(int *)(puVar8 + -4) = iVar13;
      puVar8[iVar21] = (int)uVar4 < 0x8000;
      if (*(int *)(puVar8 + -8) <= *(int *)(puVar8 + -4) + 1) {
        stbiw__sbgrowf(&local_a8,1,iVar14);
      }
      iVar21 = *(int *)(local_a8 + -4);
      *(int *)(local_a8 + -4) = iVar21 + 1;
      local_a8[iVar21] = (uchar)uVar5;
      iVar14 = *(int *)(local_a8 + -4);
      iVar21 = iVar14 + 1;
      if (*(int *)(local_a8 + -8) <= iVar21) {
        stbiw__sbgrowf(&local_a8,1,iVar21);
        iVar14 = *(int *)(local_a8 + -4);
        iVar21 = iVar14 + 1;
      }
      *(int *)(local_a8 + -4) = iVar21;
      local_a8[iVar14] = (uchar)(uVar5 >> 8);
      iVar14 = *(int *)(local_a8 + -4);
      iVar21 = iVar14 + 1;
      if (*(int *)(local_a8 + -8) <= iVar21) {
        stbiw__sbgrowf(&local_a8,1,iVar21);
        iVar14 = *(int *)(local_a8 + -4);
        iVar21 = iVar14 + 1;
      }
      *(int *)(local_a8 + -4) = iVar21;
      local_a8[iVar14] = (uchar)~uVar5;
      if (*(int *)(local_a8 + -8) <= *(int *)(local_a8 + -4) + 1) {
        stbiw__sbgrowf(&local_a8,1,iVar21);
      }
      puVar8 = local_a8;
      iVar21 = *(int *)(local_a8 + -4);
      *(int *)(local_a8 + -4) = iVar21 + 1;
      local_a8[iVar21] = (uchar)(~uVar5 >> 8);
      memcpy(local_a8 + *(int *)(local_a8 + -4),local_88 + iVar12,(long)(int)uVar5);
      iVar21 = *(int *)(puVar8 + -4) + uVar5;
      *(int *)(puVar8 + -4) = iVar21;
      iVar12 = iVar12 + uVar5;
      uVar19 = extraout_RDX;
    }
  }
  puVar20 = (uchar *)((long)((ulong)(uint)((int)local_90 >> 0x1f) << 0x20 | local_90 & 0xffffffff) %
                      0x15b0 & 0xffffffff);
  uVar4 = 1;
  uVar5 = 0;
  puVar17 = puVar20;
  for (iVar21 = 0; iVar21 < (int)local_90; iVar21 = iVar21 + iVar12) {
    iVar12 = (int)puVar20;
    puVar17 = (uchar *)0x0;
    if (0 < iVar12) {
      puVar17 = puVar20;
    }
    for (puVar20 = (uchar *)0x0; puVar17 != puVar20; puVar20 = puVar20 + 1) {
      uVar4 = uVar4 + (local_88 + iVar21)[(long)puVar20];
      uVar5 = uVar5 + uVar4;
    }
    uVar4 = uVar4 % 0xfff1;
    puVar17 = (uchar *)((ulong)uVar5 % 0xfff1);
    puVar20 = (uchar *)0x15b0;
    uVar5 = (uint)puVar17;
  }
  if (puVar8 != (uchar *)0x0) {
    iVar12 = *(int *)(puVar8 + -4);
    iVar21 = iVar12 + 1;
    puVar17 = puVar8;
    if (iVar21 < *(int *)(puVar8 + -8)) goto LAB_001b4704;
  }
  stbiw__sbgrowf(&local_a8,1,(int)puVar17);
  iVar12 = *(int *)(local_a8 + -4);
  iVar21 = iVar12 + 1;
  puVar8 = local_a8;
LAB_001b4704:
  *(int *)(puVar8 + -4) = iVar21;
  puVar8[iVar12] = (uchar)(uVar5 >> 8);
  if (*(int *)(puVar8 + -8) <= *(int *)(puVar8 + -4) + 1) {
    stbiw__sbgrowf(&local_a8,1,(int)puVar8);
    puVar8 = extraout_RDX_00;
  }
  iVar14 = (int)puVar8;
  iVar21 = *(int *)(local_a8 + -4);
  *(int *)(local_a8 + -4) = iVar21 + 1;
  local_a8[iVar21] = (uchar)uVar5;
  iVar12 = *(int *)(local_a8 + -4);
  iVar21 = iVar12 + 1;
  if (*(int *)(local_a8 + -8) <= iVar21) {
    stbiw__sbgrowf(&local_a8,1,iVar14);
    iVar12 = *(int *)(local_a8 + -4);
    iVar21 = iVar12 + 1;
    iVar14 = extraout_EDX_00;
  }
  *(int *)(local_a8 + -4) = iVar21;
  local_a8[iVar12] = (uchar)(uVar4 >> 8);
  iVar12 = *(int *)(local_a8 + -4);
  iVar21 = iVar12 + 1;
  if (*(int *)(local_a8 + -8) <= iVar21) {
    stbiw__sbgrowf(&local_a8,1,iVar14);
    iVar12 = *(int *)(local_a8 + -4);
    iVar21 = iVar12 + 1;
  }
  *(int *)(local_a8 + -4) = iVar21;
  local_a8[iVar12] = (uchar)uVar4;
  iVar21 = *(int *)(local_a8 + -4);
  *local_50 = iVar21;
  puVar8 = (uchar *)memmove(local_a8 + -8,local_a8,(long)iVar21);
  return puVar8;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   // store uncompressed instead if compression was worse
   if (stbiw__sbn(out) > data_len + 2 + ((data_len+32766)/32767)*5) {
      stbiw__sbn(out) = 2;  // truncate to DEFLATE 32K window and FLEVEL = 1
      for (j = 0; j < data_len;) {
         int blocklen = data_len - j;
         if (blocklen > 32767) blocklen = 32767;
         stbiw__sbpush(out, data_len - j == blocklen); // BFINAL = ?, BTYPE = 0 -- no compression
         stbiw__sbpush(out, STBIW_UCHAR(blocklen)); // LEN
         stbiw__sbpush(out, STBIW_UCHAR(blocklen >> 8));
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen)); // NLEN
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen >> 8));
         memcpy(out+stbiw__sbn(out), data+j, blocklen);
         stbiw__sbn(out) += blocklen;
         j += blocklen;
      }
   }

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}